

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O0

int __thiscall Directory::mkdir(Directory *this,char *__path,__mode_t __mode)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  undefined8 uVar4;
  int rv;
  string fullPath;
  Directory *in_stack_000000a8;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  string local_60 [32];
  string local_40 [36];
  __mode_t local_1c;
  char *local_18;
  Directory *local_10;
  bool local_1;
  
  local_1c = __mode;
  local_18 = __path;
  local_10 = this;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),__path);
  std::operator+(in_stack_ffffffffffffff68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  std::__cxx11::string::~string(local_60);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = ::mkdir(pcVar2,(local_1c ^ 0xffffffff) & 0x1ff | 0x4000);
  if (iVar1 == 0) {
    local_1 = refresh(in_stack_000000a8);
  }
  else {
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    uVar4 = std::__cxx11::string::c_str();
    softHSMLog(3,"mkdir",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/Directory.cpp"
               ,0xee,"Failed to create the directory (%s): %s",pcVar2,uVar4);
    local_1 = false;
  }
  uVar4 = std::__cxx11::string::~string(local_40);
  return (uint)CONCAT71((int7)((ulong)uVar4 >> 8),local_1) & 0xffffff01;
}

Assistant:

bool Directory::mkdir(std::string name, int umask)
{
	std::string fullPath = path + OS_PATHSEP + name;

#ifndef _WIN32
	int rv = ::mkdir(fullPath.c_str(), S_IFDIR | ((S_IRWXU | S_IRWXG | S_IRWXO) & ~umask));
#else
	(void)umask;
	int rv = _mkdir(fullPath.c_str());
#endif

	if (rv != 0)
	{
		ERROR_MSG("Failed to create the directory (%s): %s", strerror(errno), fullPath.c_str());

		return false;
	}

	return refresh();
}